

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::PerVertexValidationTest::getTestIterationName_abi_cxx11_
          (string *__return_storage_ptr__,PerVertexValidationTest *this,_test_iteration iteration)

{
  allocator<char> local_1e;
  undefined1 local_1d;
  _test_iteration local_1c;
  PerVertexValidationTest *pPStack_18;
  _test_iteration iteration_local;
  PerVertexValidationTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = iteration;
  pPStack_18 = this;
  this_local = (PerVertexValidationTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"?!",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  switch(local_1c) {
  case TEST_ITERATION_FIRST:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Input gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_ClipDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_CullDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_PointSize usage in a separable Vertex Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Output gl_Position usage in a separable Vertex Shader without gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_VS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Geometry and Vertex Shaders use different gl_PerVertex block redeclaration");
    break;
  case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_TC_TE_VS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Geometry, Tessellation Control, Tessellation Evaluation and Vertex Shaders use a different gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_TC_TE_VS:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tesselation Control, Tessellation Evaluation and Vertex Shaders use a different gl_PerVertex block redeclaration"
              );
    break;
  case TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "No gl_PerVertex block defined in shader programs for all shader stages supported by the running context"
              );
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Unknown");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getTestIterationName(_test_iteration iteration) const
{
	std::string result = "?!";

	switch (iteration)
	{
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
		result = "Input gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
		result = "Input gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE:
		result = "Input gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE:
		result = "Input gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Geometry Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Tessellation Control Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex "
				 "block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Tessellation Evaluation Shader without gl_PerVertex "
				 "block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Tessellation Evaluation Shader without gl_PerVertex block "
				 "redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE:
		result = "Output gl_ClipDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE:
		result = "Output gl_CullDistance usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE:
		result = "Output gl_PointSize usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE:
		result = "Output gl_Position usage in a separable Vertex Shader without gl_PerVertex block redeclaration";
		break;

	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_VS:
		result = "Geometry and Vertex Shaders use different gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_GS_TC_TE_VS:
		result = "Geometry, Tessellation Control, Tessellation Evaluation and Vertex Shaders use a different "
				 "gl_PerVertex block redeclaration";
		break;
	case TEST_ITERATION_PERVERTEX_DECLARATION_MISMATCH_TC_TE_VS:
		result = "Tesselation Control, Tessellation Evaluation and Vertex Shaders use a different gl_PerVertex block "
				 "redeclaration";
		break;

	case TEST_ITERATION_PERVERTEX_BLOCK_UNDEFINED:
		result =
			"No gl_PerVertex block defined in shader programs for all shader stages supported by the running context";
		break;
	default:
		result = "Unknown";
		break;
	}

	return result;
}